

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

shared_ptr<chaiscript::AST_Node>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,std::shared_ptr<chaiscript::AST_Node>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
          (element_type *param_1,undefined8 param_2,undefined8 param_3,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::AST_Node> sVar1;
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  element_type *this;
  
  this = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,0);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (in_stack_00000098,in_stack_00000090);
  Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
  ::operator()((Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>
                *)this,(shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)param_1);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)0x3bd7f9);
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = param_1;
  return (shared_ptr<chaiscript::AST_Node>)
         sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }